

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

double cross_entropy<unsigned_long,unsigned_int>
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *P,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *Q)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  undefined1 auVar6 [16];
  undefined8 uVar8;
  undefined1 auVar7 [64];
  undefined1 extraout_var [56];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double q;
  double p;
  size_t i;
  double m;
  double n;
  double H0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff88;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff90;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffff98;
  size_type sVar11;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffffa0;
  undefined8 local_50;
  undefined8 local_18;
  
  uVar8 = 0;
  local_18 = 0.0;
  std::begin<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_ffffffffffffff88._M_current);
  std::end<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_ffffffffffffff88._M_current);
  iVar1 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int>
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                     (int)((ulong)in_stack_ffffffffffffff90._M_current >> 0x20));
  std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffff88._M_current);
  std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffff88._M_current);
  iVar2 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0);
  auVar7 = ZEXT1664(CONCAT88(uVar8,(double)iVar2));
  local_50 = 0;
  while( true ) {
    sVar11 = local_50;
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDI);
    if (sVar3 <= sVar11) break;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,local_50)
    ;
    if (*pvVar4 != 0) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RSI,local_50)
      ;
      auVar9 = auVar7._0_16_;
      if (*pvVar5 != 0) {
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (in_RDI,local_50);
        auVar9 = vcvtusi2sd_avx512f(auVar9,*pvVar4);
        auVar6._0_8_ = auVar9._0_8_ / (double)iVar1;
        auVar6._8_8_ = auVar9._8_8_;
        auVar9 = auVar6;
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (in_RSI,local_50);
        auVar9 = vcvtusi2sd_avx512f(auVar9,*pvVar5);
        auVar7._0_8_ = log2(auVar9._0_8_ / (double)iVar2);
        auVar7._8_56_ = extraout_var;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = auVar6._0_8_;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_18;
        auVar9 = vfmadd213sd_fma(auVar7._0_16_,auVar9,auVar10);
        auVar7 = ZEXT1664(auVar9);
        local_18 = auVar9._0_8_;
      }
    }
    local_50 = local_50 + 1;
  }
  return -local_18;
}

Assistant:

double cross_entropy(const std::vector<X>& P, const std::vector<Y>& Q)
{
    double H0 = 0.0;
    double n = std::accumulate(std::begin(P), std::end(P), 0);
    double m = std::accumulate(std::begin(Q), std::end(Q), 0);
    for (size_t i = 0; i < P.size(); i++) {
        if (P[i] != 0 && Q[i] != 0) {
            double p = double(P[i]) / n;
            double q = double(Q[i]) / m;
            H0 += (p * log2(q));
        }
    }
    return -H0;
}